

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

aiCamera * __thiscall
Assimp::BlenderImporter::ConvertCamera
          (BlenderImporter *this,Scene *param_1,Object *obj,Camera *cam,ConversionData *param_4)

{
  float fVar1;
  ai_uint32 aVar2;
  aiCamera *paVar3;
  size_t sVar4;
  char *__s;
  float fVar5;
  
  paVar3 = (aiCamera *)operator_new(0x438);
  (paVar3->mName).length = 0;
  (paVar3->mName).data[0] = '\0';
  memset((paVar3->mName).data + 1,0x1b,0x3ff);
  paVar3->mHorizontalFOV = 0.7853982;
  paVar3->mClipPlaneNear = 0.1;
  paVar3->mClipPlaneFar = 1000.0;
  paVar3->mAspect = 0.0;
  __s = (obj->id).name + 2;
  sVar4 = strlen(__s);
  aVar2 = (ai_uint32)sVar4;
  if ((int)aVar2 < 0x400) {
    (paVar3->mName).length = aVar2;
    memcpy((paVar3->mName).data,__s,(long)(int)aVar2);
    (paVar3->mName).data[(int)aVar2] = '\0';
  }
  (paVar3->mPosition).x = 0.0;
  (paVar3->mPosition).y = 0.0;
  *(undefined8 *)&(paVar3->mPosition).z = 0;
  (paVar3->mUp).y = 1.0;
  (paVar3->mUp).z = 0.0;
  (paVar3->mLookAt).x = 0.0;
  (paVar3->mLookAt).y = 0.0;
  (paVar3->mLookAt).z = -1.0;
  fVar5 = cam->sensor_x;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    fVar1 = cam->lens;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar5 = atan2f(fVar5,fVar1 + fVar1);
      paVar3->mHorizontalFOV = fVar5 + fVar5;
    }
  }
  fVar5 = cam->clipend;
  paVar3->mClipPlaneNear = cam->clipsta;
  paVar3->mClipPlaneFar = fVar5;
  return paVar3;
}

Assistant:

aiCamera* BlenderImporter::ConvertCamera(const Scene& /*in*/, const Object* obj, const Camera* cam, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiCamera> out(new aiCamera());
    out->mName = obj->id.name+2;
    out->mPosition = aiVector3D(0.f, 0.f, 0.f);
    out->mUp = aiVector3D(0.f, 1.f, 0.f);
    out->mLookAt = aiVector3D(0.f, 0.f, -1.f);
    if (cam->sensor_x && cam->lens) {
        out->mHorizontalFOV = 2.f * std::atan2(cam->sensor_x,  2.f * cam->lens);
    }
    out->mClipPlaneNear = cam->clipsta;
    out->mClipPlaneFar = cam->clipend;

    return out.release();
}